

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall chatra::RuntimeImp::getPackagesState(RuntimeImp *this)

{
  long in_RSI;
  
  getPackagesState((vector<chatra::debugger::PackageState,_std::allocator<chatra::debugger::PackageState>_>
                    *)this,(RuntimeImp *)(in_RSI + -0x18));
  return;
}

Assistant:

std::vector<debugger::PackageState> RuntimeImp::getPackagesState() {
	CHATRA_CHECK_RUNTIME_PAUSED;

	std::vector<debugger::PackageState> ret;
	packageIds.forEach([&](const Package& package) {
		if (package.getId() == finalizerPackageId)
			return;

		ret.emplace_back();
		auto& v = ret.back();

		v.packageId = package.getId();
		v.packageName = package.name;

		{
			std::lock_guard<SpinLock> lock1(package.lockInstances);
			if (package.instances.size() == 1 && isInteractiveInstance(*package.instances.cbegin()->second))
				return;
		}
		v.scripts = package.scripts;
	});
	return ret;
}